

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_context_init(cubeb_conflict *ctx)

{
  int iVar1;
  pa_mainloop_api *ppVar2;
  undefined8 uVar3;
  void *in_RDI;
  int r;
  cubeb_conflict *in_stack_ffffffffffffffd8;
  cubeb_conflict *in_stack_ffffffffffffffe0;
  cubeb_conflict *ctx_00;
  
  if (*(long *)((long)in_RDI + 0x18) != 0) {
    pulse_context_destroy(in_stack_ffffffffffffffe0);
  }
  ctx_00 = (cubeb_conflict *)cubeb_pa_context_new;
  ppVar2 = (*cubeb_pa_threaded_mainloop_get_api)(*(pa_threaded_mainloop **)((long)in_RDI + 0x10));
  uVar3 = (*(code *)ctx_00)(ppVar2,*(undefined8 *)((long)in_RDI + 0x28));
  *(undefined8 *)((long)in_RDI + 0x18) = uVar3;
  if (*(long *)((long)in_RDI + 0x18) != 0) {
    (*cubeb_pa_context_set_state_callback)
              (*(pa_context **)((long)in_RDI + 0x18),context_state_callback,in_RDI);
    (*cubeb_pa_threaded_mainloop_lock)(*(pa_threaded_mainloop **)((long)in_RDI + 0x10));
    iVar1 = (*cubeb_pa_context_connect)
                      (*(pa_context **)((long)in_RDI + 0x18),(char *)0x0,PA_CONTEXT_NOFLAGS,
                       (pa_spawn_api *)0x0);
    if ((-1 < iVar1) && (iVar1 = wait_until_context_ready(in_stack_ffffffffffffffd8), iVar1 == 0)) {
      (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)((long)in_RDI + 0x10));
      *(undefined4 *)((long)in_RDI + 0x30) = 0;
      return 0;
    }
    (*cubeb_pa_threaded_mainloop_unlock)(*(pa_threaded_mainloop **)((long)in_RDI + 0x10));
    pulse_context_destroy(ctx_00);
    *(undefined8 *)((long)in_RDI + 0x18) = 0;
  }
  return -1;
}

Assistant:

static int
pulse_context_init(cubeb * ctx)
{
  int r;

  if (ctx->context) {
    assert(ctx->error == 1);
    pulse_context_destroy(ctx);
  }

  ctx->context = WRAP(pa_context_new)(WRAP(pa_threaded_mainloop_get_api)(ctx->mainloop),
                                      ctx->context_name);
  if (!ctx->context) {
    return -1;
  }
  WRAP(pa_context_set_state_callback)(ctx->context, context_state_callback, ctx);

  WRAP(pa_threaded_mainloop_lock)(ctx->mainloop);
  r = WRAP(pa_context_connect)(ctx->context, NULL, 0, NULL);

  if (r < 0 || wait_until_context_ready(ctx) != 0) {
    WRAP(pa_threaded_mainloop_unlock)(ctx->mainloop);
    pulse_context_destroy(ctx);
    ctx->context = NULL;
    return -1;
  }

  WRAP(pa_threaded_mainloop_unlock)(ctx->mainloop);

  ctx->error = 0;

  return 0;
}